

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file1.cpp
# Opt level: O2

int foobar(int argc,char **argv)

{
  ostream *poVar1;
  char *in_R8;
  string_view delim;
  string sStack_98;
  string file;
  CSVFileInfo info;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,argv[1],(allocator<char> *)&info);
    csv::get_file_info(&info,&file);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&file);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Columns: ");
    delim._M_str = in_R8;
    delim._M_len = (size_t)", ";
    csv::internals::format_row
              (&sStack_98,(internals *)&info.col_names,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2,delim);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_98);
    poVar1 = std::operator<<(poVar1,"Dimensions: ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," rows x ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," columns");
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<(poVar1,"Delimiter: ");
    poVar1 = std::operator<<(poVar1,info.delim);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&sStack_98);
    csv::CSVFileInfo::~CSVFileInfo(&info);
    std::__cxx11::string::~string((string *)&file);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," [file]");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int foobar(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    std::string file = argv[1];
    auto info = get_file_info(file);

    std::cout << file << std::endl
        << "Columns: " << internals::format_row(info.col_names, ", ")
        << "Dimensions: " << info.n_rows << " rows x " << info.n_cols << " columns" << std::endl
        << "Delimiter: " << info.delim << std::endl;

    return 0;
}